

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvObjSlot<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  DWORD DVar2;
  Var pvVar3;
  
  pvVar3 = OP_LdFrameDisplaySlot(this,instance,(uint)playout->SlotIndex1);
  uVar1 = playout->SlotIndex2;
  DVar2 = DynamicObject::GetOffsetOfAuxSlots();
  return *(Var *)(*(long *)((long)pvVar3 + (ulong)DVar2) + (ulong)uVar1 * 8);
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }